

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqliteArchive.cpp
# Opt level: O3

void __thiscall
gtar::SqliteArchive::writePtr
          (SqliteArchive *this,string *path,void *contents,size_t byteLength,CompressMode mode,
          bool immediate)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  runtime_error *prVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  undefined3 in_register_00000089;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rawSizes;
  vector<const_char_*,_std::allocator<const_char_*>_> rawTargets;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> compressedBytes;
  stringstream result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  size_t local_250;
  void *local_248;
  void *pvStack_240;
  long local_238;
  undefined8 local_228;
  string *local_220;
  ulong local_218;
  void *local_210;
  ulong local_208;
  undefined4 local_1fc;
  vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_> local_1f8;
  ulong local_1e0;
  string local_1d8 [32];
  SharedArray<char> local_1b8 [2];
  ostream local_1a8 [376];
  
  local_1fc = CONCAT31(in_register_00000089,immediate);
  local_220 = path;
  local_210 = contents;
  if (this->m_mode == Read) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Can\'t write to an archive opened for reading");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_248 = (void *)0x0;
  pvStack_240 = (void *)0x0;
  local_238 = 0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250 = byteLength;
  if (mode - FastCompress < 2) {
    local_228 = 1;
    if (byteLength != 0) {
      uVar6 = 1000000000;
      uVar8 = 0;
      uVar3 = 0;
      do {
        uVar7 = byteLength - uVar8;
        if (499999999 < uVar7) {
          uVar7 = 500000000;
        }
        local_208 = uVar3;
        local_1e0 = uVar6;
        iVar1 = LZ4_compressBound((int)uVar7);
        local_218 = CONCAT44(local_218._4_4_,iVar1);
        pcVar2 = (char *)operator_new__((long)iVar1);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)operator_new(0x18);
        (local_1b8[0].m_shim)->m_target = pcVar2;
        (local_1b8[0].m_shim)->m_length = (long)iVar1;
        (local_1b8[0].m_shim)->m_count = 1;
        std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
        emplace_back<gtar::SharedArray<char>>
                  ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                   &local_1f8,local_1b8);
        SharedArray<char>::release(local_1b8);
        byteLength = local_250;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)0x0;
        }
        else {
          local_1b8[0].m_shim =
               (SharedArrayShim<char> *)
               (local_1f8.
                super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_248,(char **)local_1b8)
        ;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = (local_1f8.
                    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        iVar1 = LZ4_compress_default
                          ((char *)(uVar8 + (long)local_210),pcVar2,(int)uVar7,(int)local_218);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)(long)iVar1;
        if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = local_208 +
                local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        uVar8 = local_1e0 >> 1;
        uVar6 = local_1e0 + 1000000000;
      } while (uVar8 < byteLength);
      goto LAB_0011172a;
    }
  }
  else if (mode == SlowCompress) {
    local_228 = 1;
    if (byteLength != 0) {
      uVar6 = 1000000000;
      uVar8 = 0;
      uVar3 = 0;
      do {
        uVar7 = byteLength - uVar8;
        if (499999999 < uVar7) {
          uVar7 = 500000000;
        }
        local_218 = uVar6;
        local_208 = uVar3;
        iVar1 = LZ4_compressBound((int)uVar7);
        pcVar2 = (char *)operator_new__((long)iVar1);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)operator_new(0x18);
        (local_1b8[0].m_shim)->m_target = pcVar2;
        (local_1b8[0].m_shim)->m_length = (long)iVar1;
        (local_1b8[0].m_shim)->m_count = 1;
        std::vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>>::
        emplace_back<gtar::SharedArray<char>>
                  ((vector<gtar::SharedArray<char>,std::allocator<gtar::SharedArray<char>>> *)
                   &local_1f8,local_1b8);
        SharedArray<char>::release(local_1b8);
        byteLength = local_250;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)0x0;
        }
        else {
          local_1b8[0].m_shim =
               (SharedArrayShim<char> *)
               (local_1f8.
                super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_248,(char **)local_1b8)
        ;
        if (local_1f8.
            super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].m_shim == (SharedArrayShim<char> *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = (local_1f8.
                    super__Vector_base<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_shim)->m_target;
        }
        iVar1 = LZ4_compress_HC((char *)(uVar8 + (long)local_210),pcVar2,(int)uVar7,iVar1,0xb);
        local_1b8[0].m_shim = (SharedArrayShim<char> *)(long)iVar1;
        if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = local_208 +
                local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        uVar8 = local_218 >> 1;
        uVar6 = local_218 + 1000000000;
      } while (uVar8 < byteLength);
      goto LAB_0011172a;
    }
  }
  else {
    if (byteLength != 0) {
      uVar3 = 1000000000;
      uVar6 = 0;
      do {
        local_1b8[0].m_shim = (SharedArrayShim<char> *)((long)local_210 + uVar6);
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_248,(char **)local_1b8)
        ;
        local_1b8[0].m_shim = (SharedArrayShim<char> *)(local_250 - uVar6);
        if ((SharedArrayShim<char> *)0x1dcd64ff < local_1b8[0].m_shim) {
          local_1b8[0].m_shim = (SharedArrayShim<char> *)0x1dcd6500;
        }
        if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_268,
                     (iterator)
                     local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1b8);
        }
        else {
          *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_1b8[0].m_shim;
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar6 = uVar3 >> 1;
        uVar3 = uVar3 + 1000000000;
      } while (uVar6 < local_250);
      local_228 = 0;
      uVar3 = local_250;
      byteLength = local_250;
      goto LAB_0011172a;
    }
    local_228 = 0;
  }
  uVar3 = 0;
LAB_0011172a:
  sqlite3_bind_text(this->m_insert_filename_stmt,1,(local_220->_M_dataplus)._M_p,
                    (int)local_220->_M_string_length,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int64(this->m_insert_filename_stmt,2,byteLength);
  sqlite3_bind_int64(this->m_insert_filename_stmt,3,uVar3);
  sqlite3_bind_int(this->m_insert_filename_stmt,4,(int)local_228);
  sqlite3_bind_text(this->m_insert_contents_stmt,1,(local_220->_M_dataplus)._M_p,
                    (int)local_220->_M_string_length,(_func_void_void_ptr *)0x0);
  if ((char)local_1fc == '\0') {
    do {
      iVar1 = sqlite3_step(this->m_insert_filename_stmt);
    } while (iVar1 == 5);
    if (pvStack_240 != local_248) {
      uVar3 = 0;
      do {
        sqlite3_bind_blob(this->m_insert_contents_stmt,2,*(void **)((long)local_248 + uVar3 * 8),
                          (int)local_268.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3],
                          (_func_void_void_ptr *)0x0);
        sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar3);
        do {
          iVar1 = sqlite3_step(this->m_insert_contents_stmt);
        } while (iVar1 == 5);
        sqlite3_reset(this->m_insert_contents_stmt);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)pvStack_240 - (long)local_248 >> 3));
    }
  }
  else {
    iVar1 = 5;
    while (iVar1 == 5) {
      sqlite3_step(this->m_begin_stmt);
      sqlite3_step(this->m_insert_filename_stmt);
      if (pvStack_240 != local_248) {
        uVar3 = 0;
        do {
          sqlite3_bind_blob(this->m_insert_contents_stmt,2,*(void **)((long)local_248 + uVar3 * 8),
                            (int)local_268.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar3],
                            (_func_void_void_ptr *)0x0);
          sqlite3_bind_int64(this->m_insert_contents_stmt,3,uVar3);
          iVar1 = sqlite3_step(this->m_insert_contents_stmt);
          if (iVar1 != 0x65) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Couldn\'t insert chunk in sqlite database: ",0x2a);
            pcVar2 = sqlite3_errstr(iVar1);
            std::operator<<(local_1a8,pcVar2);
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar4,local_1d8);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sqlite3_reset(this->m_insert_contents_stmt);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)((long)pvStack_240 - (long)local_248 >> 3));
      }
      iVar1 = sqlite3_step(this->m_end_stmt);
    }
  }
  sqlite3_clear_bindings(this->m_insert_filename_stmt);
  sqlite3_clear_bindings(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_begin_stmt);
  sqlite3_reset(this->m_insert_filename_stmt);
  sqlite3_reset(this->m_insert_contents_stmt);
  sqlite3_reset(this->m_end_stmt);
  if (iVar1 != 0x65) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Error inserting record at ",0x1a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(local_220->_M_dataplus)._M_p,local_220->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar2 = sqlite3_errmsg(this->m_connection);
    std::operator<<(local_1a8,pcVar2);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_1d8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_fileNames,local_220);
  std::vector<gtar::SharedArray<char>,_std::allocator<gtar::SharedArray<char>_>_>::~vector
            (&local_1f8);
  if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248 != (void *)0x0) {
    operator_delete(local_248,local_238 - (long)local_248);
  }
  return;
}

Assistant:

void SqliteArchive::writePtr(const string &path, const void *contents,
                                 const size_t byteLength, CompressMode mode,
                                 bool immediate)
    {
        if(m_mode == Read)
            throw runtime_error("Can't write to an archive opened for reading");

        vector<const char*> rawTargets;
        vector<size_t> rawSizes;
        size_t compressedSize(0);
        unsigned int rawCompression(0);
        vector<SharedArray<char> > compressedBytes;

        if(mode == FastCompress || mode == MediumCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_default(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else if(mode == SlowCompress)
        {
            for(size_t chunkidx(0); chunkidx*LZ4_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) LZ4_CHUNK_SIZE, byteLength - chunkidx*LZ4_CHUNK_SIZE));
                const int maxSize(LZ4_compressBound(sourceSize));

                compressedBytes.push_back(SharedArray<char>(new char[maxSize], maxSize));
                rawTargets.push_back(compressedBytes.back().get());
                rawSizes.push_back(LZ4_compress_HC(
                                       ((const char*) contents) + chunkidx*LZ4_CHUNK_SIZE,
                                       compressedBytes.back().get(), sourceSize,
                                       maxSize, LZ4HC_CLEVEL_OPT_MIN));
                compressedSize += rawSizes.back();
            }
            rawCompression = 1;
        }
        else
        {
            for(size_t chunkidx(0); chunkidx*RAW_CHUNK_SIZE < byteLength; ++chunkidx)
            {
                const int sourceSize(min((size_t) RAW_CHUNK_SIZE, byteLength - chunkidx*RAW_CHUNK_SIZE));
                rawTargets.push_back(((const char*) contents) + chunkidx*RAW_CHUNK_SIZE);
                rawSizes.push_back(sourceSize);
            }
            compressedSize = byteLength;
        }

        sqlite3_bind_text(m_insert_filename_stmt, 1, path.c_str(), path.size(), 0);
        sqlite3_bind_int64(m_insert_filename_stmt, 2, byteLength);
        sqlite3_bind_int64(m_insert_filename_stmt, 3, compressedSize);
        sqlite3_bind_int(m_insert_filename_stmt, 4, rawCompression);

        sqlite3_bind_text(m_insert_contents_stmt, 1, path.c_str(), path.size(), 0);

        int status(SQLITE_BUSY);

        if(immediate)
        {
            while(status == SQLITE_BUSY)
            {
                status = sqlite3_step(m_begin_stmt);

                status = sqlite3_step(m_insert_filename_stmt);

                for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
                {
                    sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                        rawSizes[chunkidx], 0);
                    sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                    status = sqlite3_step(m_insert_contents_stmt);

                    if(status != SQLITE_DONE)
                    {
                        stringstream result;
                        result << "Couldn't insert chunk in sqlite database: ";
                        result << sqlite3_errstr(status);
                        throw runtime_error(result.str());
                    }

                    sqlite3_reset(m_insert_contents_stmt);
                }

                status = sqlite3_step(m_end_stmt);
            }
        }
        else
        {
            do {status = sqlite3_step(m_insert_filename_stmt);} while(status == SQLITE_BUSY);

            for(size_t chunkidx(0); chunkidx < rawTargets.size(); ++chunkidx)
            {
                sqlite3_bind_blob(m_insert_contents_stmt, 2, (const void*) rawTargets[chunkidx],
                                    rawSizes[chunkidx], 0);
                sqlite3_bind_int64(m_insert_contents_stmt, 3, chunkidx);
                do {status = sqlite3_step(m_insert_contents_stmt);} while(status == SQLITE_BUSY);
                sqlite3_reset(m_insert_contents_stmt);
            }
        }

        sqlite3_clear_bindings(m_insert_filename_stmt);
        sqlite3_clear_bindings(m_insert_contents_stmt);
        sqlite3_reset(m_begin_stmt);
        sqlite3_reset(m_insert_filename_stmt);
        sqlite3_reset(m_insert_contents_stmt);
        sqlite3_reset(m_end_stmt);

        if(status != SQLITE_DONE)
        {
            stringstream result;
            result << "Error inserting record at " << path << ": ";
            result << sqlite3_errmsg(m_connection);
            throw runtime_error(result.str());
        }

        m_fileNames.push_back(path);
    }